

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O1

bool __thiscall
QTranslatorPrivate::do_load(QTranslatorPrivate *this,uchar *data,qsizetype len,QString *directory)

{
  byte bVar1;
  QArrayData *data_00;
  QIODevice *pQVar2;
  undefined1 *puVar3;
  pointer puVar4;
  pointer puVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  QTranslator *pQVar9;
  bool bVar10;
  uint uVar11;
  QString *pQVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  pointer *__ptr;
  char16_t *pcVar18;
  pointer puVar19;
  long in_FS_OFFSET;
  QByteArrayView ba;
  __single_object translator;
  _Head_base<0UL,_QTranslator_*,_false> local_a0;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (int)len;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  lVar17 = len + -5;
  pcVar18 = (char16_t *)(data + 0x10);
  bVar10 = true;
  do {
    if (data + lVar17 <= pcVar18) break;
    bVar1 = (byte)*pcVar18;
    uVar8 = *(uint *)((long)pcVar18 + 1);
    pcVar18 = (char16_t *)((long)pcVar18 + 5);
    if (uVar8 == 0 || bVar1 == 0) {
      len = 0;
    }
    else {
      uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      len = 0;
      if ((uint)(((int)data + iVar6) - (int)pcVar18) < uVar8) {
        bVar10 = false;
      }
      else {
        pQVar12 = (QString *)(ulong)uVar8;
        if (bVar1 < 0x88) {
          if (bVar1 == 0x2f) {
            this->contextArray = (uchar *)pcVar18;
            this->contextLength = uVar8;
          }
          else if (bVar1 == 0x42) {
            this->offsetArray = (uchar *)pcVar18;
            this->offsetLength = uVar8;
          }
          else if (bVar1 == 0x69) {
            this->messageArray = (uchar *)pcVar18;
            this->messageLength = uVar8;
          }
        }
        else if (bVar1 == 0x88) {
          this->numerusRulesArray = (uchar *)pcVar18;
          this->numerusRulesLength = uVar8;
        }
        else if (bVar1 == 0x96) {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = pcVar18;
          local_98.d.size = (qsizetype)pQVar12;
          QDataStream::QDataStream((QDataStream *)local_58,(QByteArray *)&local_98);
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
            }
          }
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = (char16_t *)0x0;
          local_98.d.size = 0;
          while (bVar7 = QDataStream::atEnd((QDataStream *)local_58), !bVar7) {
            ::operator>>((QDataStream *)local_58,&local_98);
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_98);
            QList<QString>::end((QList<QString> *)&local_78);
          }
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            }
          }
          QDataStream::~QDataStream((QDataStream *)local_58);
        }
        else if (bVar1 == 0xa7) {
          ba.m_data._0_1_ = 0xa7;
          ba.m_size = (qsizetype)pcVar18;
          ba.m_data._1_7_ = 0;
          QString::fromUtf8((QString *)local_58,pQVar12,ba);
          data_00 = &((this->language).d.d)->super_QArrayData;
          pQVar2 = (QIODevice *)(this->language).d.ptr;
          *(undefined4 *)&(this->language).d.d = local_58._0_4_;
          *(undefined4 *)((long)&(this->language).d.d + 4) = local_58._4_4_;
          *(undefined4 *)&(this->language).d.ptr = local_58._8_4_;
          *(undefined4 *)((long)&(this->language).d.ptr + 4) = local_58._12_4_;
          puVar3 = (undefined1 *)(this->language).d.size;
          (this->language).d.size = (qsizetype)local_48;
          local_58._0_8_ = data_00;
          local_58._8_8_ = pQVar2;
          local_48 = puVar3;
          if (data_00 != (QArrayData *)0x0) {
            LOCK();
            (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
                 (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(data_00,2,0x10);
            }
          }
        }
        pcVar18 = (char16_t *)((long)pcVar18 + (long)pQVar12);
        len = 1;
      }
    }
  } while ((char)len != '\0');
  bVar7 = bVar10;
  if ((bVar10 != false) && (uVar8 = this->numerusRulesLength, uVar8 != 0)) {
    uVar14 = 0;
    do {
      uVar13 = (uint)uVar14;
      bVar1 = this->numerusRulesArray[uVar14];
      uVar11 = uVar13;
      if (((char)bVar1 < '\0') || (uVar11 = uVar13 + 1, uVar11 == uVar8)) {
LAB_002d016e:
        len = 0;
        bVar7 = false;
      }
      else {
        uVar15 = bVar1 & 7;
        uVar11 = uVar13 + 2;
        if (2 < uVar15 - 1) {
          if ((uVar15 != 4) || (uVar11 == uVar8)) goto LAB_002d016e;
          uVar11 = uVar13 + 3;
        }
        bVar7 = uVar11 != uVar8;
        len = (qsizetype)(byte)((byte)len | uVar11 == uVar8);
      }
      uVar16 = len;
      if (!bVar7) goto LAB_002d01c4;
      uVar14 = (ulong)(uVar11 + 1);
      uVar16 = 0;
      if ((uVar11 + 1 == uVar8) || (this->numerusRulesArray[uVar11] < 0xfd)) goto LAB_002d01c4;
    } while( true );
  }
LAB_002d01d1:
  if (bVar7 != false) {
    std::
    vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
    ::reserve(&this->subTranslators,local_78.size);
    if (local_78.size != 0) {
      lVar17 = local_78.size * 0x18;
      pQVar12 = local_78.ptr;
      do {
        lVar17 = lVar17 + -0x18;
        local_a0._M_head_impl = (QTranslator *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar9 = (QTranslator *)operator_new(0x10);
        QTranslator::QTranslator(pQVar9,(QObject *)0x0);
        local_48 = (undefined1 *)0x0;
        local_58._0_8_ = (QArrayData *)0x0;
        local_58._8_8_ = (QIODevice *)0x0;
        local_98.d.size = 0;
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char16_t *)0x0;
        local_a0._M_head_impl = pQVar9;
        bVar7 = QTranslator::load(pQVar9,pQVar12,directory,(QString *)local_58,&local_98);
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
          }
        }
        if (!bVar7) {
          if (local_a0._M_head_impl != (QTranslator *)0x0) {
            (*((local_a0._M_head_impl)->super_QObject)._vptr_QObject[4])();
          }
          break;
        }
        std::
        vector<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>,std::allocator<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>>>
        ::emplace_back<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>>
                  ((vector<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>,std::allocator<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>>>
                    *)&this->subTranslators,
                   (unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *)&local_a0);
        if (local_a0._M_head_impl != (QTranslator *)0x0) {
          (*((local_a0._M_head_impl)->super_QObject)._vptr_QObject[4])();
        }
        pQVar12 = pQVar12 + 1;
      } while (bVar7 && lVar17 != 0);
    }
    if (bVar7 == false) {
      puVar4 = (this->subTranslators).
               super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = (this->subTranslators).
               super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar19 = puVar4;
      if (puVar5 != puVar4) {
        do {
          pQVar9 = (puVar19->_M_t).
                   super___uniq_ptr_impl<QTranslator,_std::default_delete<QTranslator>_>._M_t.
                   super__Tuple_impl<0UL,_QTranslator_*,_std::default_delete<QTranslator>_>.
                   super__Head_base<0UL,_QTranslator_*,_false>._M_head_impl;
          if (pQVar9 != (QTranslator *)0x0) {
            (**(code **)((long)(pQVar9->super_QObject)._vptr_QObject + 0x20))();
          }
          (puVar19->_M_t).super___uniq_ptr_impl<QTranslator,_std::default_delete<QTranslator>_>._M_t
          .super__Tuple_impl<0UL,_QTranslator_*,_std::default_delete<QTranslator>_>.
          super__Head_base<0UL,_QTranslator_*,_false>._M_head_impl = (QTranslator *)0x0;
          puVar19 = puVar19 + 1;
        } while (puVar19 != puVar5);
        (this->subTranslators).
        super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar4;
      }
    }
  }
  if (bVar7 == false) {
    this->messageLength = 0;
    this->offsetLength = 0;
    this->contextLength = 0;
    this->numerusRulesLength = 0;
    this->contextArray = (uchar *)0x0;
    this->numerusRulesArray = (uchar *)0x0;
    this->messageArray = (uchar *)0x0;
    this->offsetArray = (uchar *)0x0;
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
LAB_002d01c4:
  bVar7 = false;
  if ((uVar16 & 1) != 0) {
    bVar7 = bVar10;
  }
  goto LAB_002d01d1;
}

Assistant:

bool QTranslatorPrivate::do_load(const uchar *data, qsizetype len, const QString &directory)
{
    bool ok = true;
    const uchar *end = data + len;

    data += MagicLength;

    QStringList dependencies;
    while (data < end - 5) {
        quint8 tag = read8(data++);
        quint32 blockLen = read32(data);
        data += 4;
        if (!tag || !blockLen)
            break;
        if (quint32(end - data) < blockLen) {
            ok = false;
            break;
        }

        if (tag == QTranslatorPrivate::Language) {
            language = QString::fromUtf8((const char *)data, blockLen);
        } else if (tag == QTranslatorPrivate::Contexts) {
            contextArray = data;
            contextLength = blockLen;
        } else if (tag == QTranslatorPrivate::Hashes) {
            offsetArray = data;
            offsetLength = blockLen;
        } else if (tag == QTranslatorPrivate::Messages) {
            messageArray = data;
            messageLength = blockLen;
        } else if (tag == QTranslatorPrivate::NumerusRules) {
            numerusRulesArray = data;
            numerusRulesLength = blockLen;
        } else if (tag == QTranslatorPrivate::Dependencies) {
            QDataStream stream(QByteArray::fromRawData((const char*)data, blockLen));
            QString dep;
            while (!stream.atEnd()) {
                stream >> dep;
                dependencies.append(dep);
            }
        }

        data += blockLen;
    }

    if (ok && !isValidNumerusRules(numerusRulesArray, numerusRulesLength))
        ok = false;
    if (ok) {
        subTranslators.reserve(std::size_t(dependencies.size()));
        for (const QString &dependency : std::as_const(dependencies)) {
            auto translator = std::make_unique<QTranslator>();
            ok = translator->load(dependency, directory);
            if (!ok)
                break;
            subTranslators.push_back(std::move(translator));
        }

        // In case some dependencies fail to load, unload all the other ones too.
        if (!ok)
            subTranslators.clear();
    }

    if (!ok) {
        messageArray = nullptr;
        contextArray = nullptr;
        offsetArray = nullptr;
        numerusRulesArray = nullptr;
        messageLength = 0;
        contextLength = 0;
        offsetLength = 0;
        numerusRulesLength = 0;
    }

    return ok;
}